

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

string * duckdb::FileSystem::GetEnvVariable(string *__return_storage_ptr__,string *name)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = getenv((name->_M_dataplus)._M_p);
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileSystem::GetEnvVariable(const string &name) {
	const char *env = getenv(name.c_str());
	if (!env) {
		return string();
	}
	return env;
}